

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEditPrivate::updateDefaultTextOption(QTextEditPrivate *this)

{
  uint uVar1;
  QTextDocument *pQVar2;
  uint uVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xffffffffffffffff;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultTextOption();
  uVar1 = (uint)local_38;
  if (this->lineWrap == NoWrap) {
    uVar3 = (uint)local_38 & 0xffffe1ff;
  }
  else {
    uVar3 = (uint)local_38 & 0xffffe1ff | (this->wordWrap & 0xf) << 9;
  }
  local_38 = (undefined1 *)CONCAT44(local_38._4_4_,uVar3);
  if (((uVar1 ^ uVar3) & 0x1e00) != 0) {
    QTextDocument::setDefaultTextOption((QTextOption *)pQVar2);
  }
  QTextOption::~QTextOption((QTextOption *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::updateDefaultTextOption()
{
    QTextDocument *doc = control->document();

    QTextOption opt = doc->defaultTextOption();
    QTextOption::WrapMode oldWrapMode = opt.wrapMode();

    if (lineWrap == QTextEdit::NoWrap)
        opt.setWrapMode(QTextOption::NoWrap);
    else
        opt.setWrapMode(wordWrap);

    if (opt.wrapMode() != oldWrapMode)
        doc->setDefaultTextOption(opt);
}